

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int eval_gop_length(double *beta,int gop_eval)

{
  bool local_19;
  int gop_eval_local;
  double *beta_local;
  uint local_4;
  
  if (gop_eval == 1) {
    local_19 = false;
    if (beta[1] + 0.7 <= *beta) {
      local_19 = 3.0 < *beta;
    }
    local_4 = (uint)local_19;
  }
  else if (gop_eval == 2) {
    if ((*beta < beta[1] + 0.4) || (*beta <= 1.6)) {
      if ((*beta < beta[1] + 0.1) || (*beta <= 1.4)) {
        local_4 = 0;
      }
      else {
        local_4 = 2;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else if (gop_eval == 3) {
    local_4 = (uint)(1.1 < *beta);
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static inline int eval_gop_length(double *beta, int gop_eval) {
  switch (gop_eval) {
    case 1:
      // Allow larger GOP size if the base layer ARF has higher dependency
      // factor than the intermediate ARF and both ARFs have reasonably high
      // dependency factors.
      return (beta[0] >= beta[1] + 0.7) && beta[0] > 3.0;
    case 2:
      if ((beta[0] >= beta[1] + 0.4) && beta[0] > 1.6)
        return 1;  // Don't shorten the gf interval
      else if ((beta[0] < beta[1] + 0.1) || beta[0] <= 1.4)
        return 0;  // Shorten the gf interval
      else
        return 2;  // Cannot decide the gf interval, so redo the
                   // tpl stats calculation.
    case 3: return beta[0] > 1.1;
    default: return 2;
  }
}